

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int __thiscall NULLCFile::FileWrite(NULLCFile *this,NULLCArray arr,File *file)

{
  size_t sVar1;
  long lVar2;
  int local_34;
  File *file_local;
  NULLCArray arr_local;
  
  lVar2 = CONCAT44((int)((ulong)register0x00000010 >> 0x20),arr.len);
  if (lVar2 == 0) {
    nullcThrowError("ERROR: null pointer access");
    arr_local.ptr._4_4_ = 0;
  }
  else if (*(long *)(lVar2 + 4) == 0) {
    nullcThrowError("Cannot write to a closed file.");
    arr_local.ptr._4_4_ = 0;
  }
  else {
    if (this == (NULLCFile *)0x0) {
      local_34 = 0;
    }
    else {
      sVar1 = fwrite(this,1,(ulong)(uint)arr.ptr,*(FILE **)(lVar2 + 4));
      local_34 = (int)sVar1;
    }
    arr_local.ptr._4_4_ = local_34;
  }
  return arr_local.ptr._4_4_;
}

Assistant:

int FileWrite(NULLCArray arr, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot write to a closed file.");
			return 0;
		}

		return arr.ptr ? int(fwrite(arr.ptr, 1, arr.len, file->handle)) : 0;
	}